

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int multiSelect(Parse *pParse,Select *p,SelectDest *pDest)

{
  Select **ppSVar1;
  byte *pbVar2;
  u32 *puVar3;
  u8 uVar4;
  undefined4 p1;
  sqlite3 *psVar5;
  SrcList *pSVar6;
  Vdbe *p_00;
  Parse *pPVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  bool bVar11;
  byte bVar12;
  LogEst LVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int p2;
  int iVar21;
  int iVar22;
  Vdbe *pVVar23;
  Select *pSVar24;
  int *zP4;
  KeyInfo *pKVar25;
  CollSeq *pCVar26;
  Expr *pEVar27;
  long lVar28;
  ExprList *pEVar29;
  Op *pOVar30;
  uint uVar31;
  Select *pSVar32;
  anon_union_4_2_6146edf4_for_u *paVar33;
  char *pcVar34;
  int nExtra;
  ulong extraout_RDX;
  ulong uVar35;
  Select *pSVar36;
  short sVar37;
  bool bVar38;
  int iVar39;
  int iVar40;
  Select *pSVar41;
  u8 uVar42;
  int iVar43;
  int iVar44;
  byte local_151;
  Select *local_138;
  SelectDest destA;
  SelectDest dest;
  KeyInfo *local_78;
  SelectDest local_58;
  
  psVar5 = pParse->db;
  pSVar41 = p->pPrior;
  dest.pOrderBy = pDest->pOrderBy;
  dest.eDest = pDest->eDest;
  dest._1_3_ = *(undefined3 *)&pDest->field_0x1;
  dest.iSDParm = pDest->iSDParm;
  uVar9 = pDest->iSDParm2;
  uVar10 = pDest->iSdst;
  dest.zAffSdst = pDest->zAffSdst;
  dest.nSdst = (int)*(undefined8 *)&pDest->nSdst;
  dest._20_4_ = SUB84((ulong)*(undefined8 *)&pDest->nSdst >> 0x20,0);
  dest.iSDParm2 = uVar9;
  dest.iSdst = uVar10;
  pVVar23 = sqlite3GetVdbe(pParse);
  uVar42 = dest.eDest;
  if (dest.eDest == '\f') {
    sqlite3VdbeAddOp3(pVVar23,0x76,dest.iSDParm,p->pEList->nExpr,0);
    dest.eDest = '\x0e';
    uVar42 = '\x0e';
  }
  if ((p->selFlags >> 10 & 1) != 0) {
    pEVar27 = p->pLimit;
    if (p->pWin == (Window *)0x0) {
      sVar37 = 1;
      pSVar24 = p;
      do {
        pSVar36 = pSVar24->pPrior;
        if (pSVar36 == (Select *)0x0) {
          sqlite3VdbeExplain(pParse,'\0',"SCAN %d CONSTANT ROW%s");
          goto LAB_001768a2;
        }
        sVar37 = sVar37 + (ushort)(pEVar27 == (Expr *)0x0);
        pSVar24 = pSVar36;
      } while (pSVar36->pWin == (Window *)0x0);
    }
  }
  pSVar24 = p;
  if ((p->selFlags >> 0xd & 1) != 0) {
    do {
      if ((pSVar24->selFlags & 0x2000) == 0) {
        if (p->pWin != (Window *)0x0) {
          sqlite3ErrorMsg(pParse,"cannot use window functions in recursive queries");
          goto LAB_00177aa5;
        }
        pSVar6 = p->pSrc;
        iVar15 = p->pEList->nExpr;
        p_00 = pParse->pVdbe;
        iVar21 = 0;
        iVar14 = sqlite3AuthCheck(pParse,0x21,(char *)0x0,(char *)0x0,(char *)0x0);
        if (iVar14 != 0) goto LAB_00177aa5;
        iVar19 = pParse->nLabel + -1;
        pParse->nLabel = iVar19;
        p->nSelectRow = 0x140;
        computeLimitRegisters(pParse,p,iVar19);
        pEVar27 = p->pLimit;
        iVar14 = p->iLimit;
        iVar20 = p->iOffset;
        p->pLimit = (Expr *)0x0;
        p->iLimit = 0;
        p->iOffset = 0;
        if ((long)pSVar6->nSrc < 1) goto LAB_0017752f;
        lVar28 = 0;
        goto LAB_00176960;
      }
      ppSVar1 = &pSVar24->pPrior;
      pSVar24 = *ppSVar1;
    } while (*ppSVar1 != (Select *)0x0);
  }
  pEVar29 = p->pOrderBy;
  if (pEVar29 != (ExprList *)0x0) {
    psVar5 = pParse->db;
    pVVar23 = pParse->pVdbe;
    iVar15 = pParse->nLabel;
    iVar14 = iVar15 + -2;
    pParse->nLabel = iVar14;
    bVar12 = p->op;
    iVar21 = pEVar29->nExpr;
    if ((bVar12 != 0x87) && (psVar5->mallocFailed == '\0')) {
      uVar16 = 1;
      do {
        if (p->pEList->nExpr < (int)uVar16) break;
        if (iVar21 < 1) {
          iVar20 = 0;
LAB_001769ae:
          if (iVar20 == iVar21) goto LAB_001769b3;
        }
        else {
          paVar33 = &pEVar29->a[0].u;
          iVar20 = 0;
          do {
            if (uVar16 == (paVar33->x).iOrderByCol) goto LAB_001769ae;
            iVar20 = iVar20 + 1;
            paVar33 = paVar33 + 6;
          } while (iVar21 != iVar20);
LAB_001769b3:
          destA.eDest = '\0';
          destA._1_3_ = 0;
          destA.iSDParm = 0;
          destA.iSDParm2 = 0;
          pEVar27 = sqlite3ExprAlloc(psVar5,0x9b,(Token *)&destA,0);
          if (pEVar27 == (Expr *)0x0) {
            return 7;
          }
          pbVar2 = (byte *)((long)&pEVar27->flags + 1);
          *pbVar2 = *pbVar2 | 8;
          (pEVar27->u).iValue = uVar16;
          pEVar29 = sqlite3ExprListAppend(pParse,pEVar29,pEVar27);
          p->pOrderBy = pEVar29;
          if (pEVar29 == (ExprList *)0x0) {
            pEVar29 = (ExprList *)0x0;
          }
          else {
            lVar28 = (long)iVar21;
            iVar21 = iVar21 + 1;
            pEVar29->a[lVar28].u.x.iOrderByCol = (u16)uVar16;
          }
        }
        uVar16 = uVar16 + 1;
      } while (psVar5->mallocFailed == '\0');
    }
    zP4 = (int *)sqlite3DbMallocRawNN(psVar5,(long)(int)(iVar21 + 1U) << 2);
    iVar20 = 0;
    if (zP4 == (int *)0x0) {
      local_78 = (KeyInfo *)0x0;
    }
    else {
      *zP4 = iVar21;
      uVar35 = extraout_RDX;
      if (0 < iVar21) {
        paVar33 = &pEVar29->a[0].u;
        uVar35 = 1;
        do {
          zP4[uVar35] = (paVar33->x).iOrderByCol - 1;
          uVar35 = uVar35 + 1;
          paVar33 = paVar33 + 6;
        } while (iVar21 + 1U != uVar35);
      }
      local_78 = multiSelectOrderByKeyInfo(pParse,p,(int)uVar35);
    }
    iVar15 = iVar15 + -1;
    pSVar41 = p;
    if (bVar12 == 0x87) {
      pKVar25 = (KeyInfo *)0x0;
    }
    else {
      uVar16 = p->pEList->nExpr;
      iVar20 = pParse->nMem + 1;
      pParse->nMem = pParse->nMem + uVar16 + 1;
      sqlite3VdbeAddOp3(pVVar23,0x47,0,iVar20,0);
      pKVar25 = sqlite3KeyInfoAlloc(psVar5,uVar16,1);
      if (0 < (int)uVar16 && pKVar25 != (KeyInfo *)0x0) {
        uVar35 = 0;
        do {
          pCVar26 = multiSelectCollSeq(pParse,p,(int)uVar35);
          pKVar25->aColl[uVar35] = pCVar26;
          pKVar25->aSortFlags[uVar35] = '\0';
          uVar35 = uVar35 + 1;
        } while (uVar16 != uVar35);
      }
      local_151 = bVar12 & 0xfe;
      if (local_151 != 0x86) {
        bVar11 = false;
        goto LAB_00176b7d;
      }
    }
    bVar11 = true;
    if (((psVar5->dbOptFlags & 0x200000) == 0) && (p->pPrior != (Select *)0x0)) {
      uVar16 = 1;
      pSVar24 = p->pPrior;
      pSVar36 = p;
      do {
        pSVar32 = pSVar24;
        if (pSVar36->op != bVar12) break;
        uVar16 = uVar16 + 1;
        pSVar24 = pSVar32->pPrior;
        pSVar36 = pSVar32;
      } while (pSVar24 != (Select *)0x0);
      if (3 < uVar16) {
        uVar31 = 2;
        do {
          pSVar41 = pSVar41->pPrior;
          uVar31 = uVar31 + 2;
        } while (uVar31 < uVar16);
        local_151 = 0x86;
        goto LAB_00176b7d;
      }
    }
    local_151 = 0x86;
LAB_00176b7d:
    pSVar24 = pSVar41->pPrior;
    pSVar41->pPrior = (Select *)0x0;
    iVar19 = 0;
    pSVar24->pNext = (Select *)0x0;
    pEVar29 = sqlite3ExprListDup(pParse->db,pEVar29,0);
    pSVar24->pOrderBy = pEVar29;
    sqlite3ResolveOrderGroupBy(pParse,p,p->pOrderBy,"ORDER");
    sqlite3ResolveOrderGroupBy(pParse,pSVar24,pSVar24->pOrderBy,"ORDER");
    computeLimitRegisters(pParse,p,iVar15);
    iVar43 = p->iLimit;
    iVar44 = 0;
    if (iVar43 != 0 && bVar12 == 0x87) {
      iVar19 = pParse->nMem + 1;
      iVar44 = pParse->nMem + 2;
      pParse->nMem = iVar44;
      iVar22 = p->iOffset + 1;
      if (p->iOffset == 0) {
        iVar22 = iVar43;
      }
      sqlite3VdbeAddOp3(pVVar23,0x50,iVar22,iVar19,0);
      sqlite3VdbeAddOp3(pVVar23,0x50,iVar19,iVar44,0);
    }
    if (p->pLimit != (Expr *)0x0) {
      sqlite3ExprDeleteNN(psVar5,p->pLimit);
    }
    p->pLimit = (Expr *)0x0;
    iVar39 = pParse->nMem;
    iVar43 = iVar39 + 1;
    iVar22 = iVar39 + 2;
    iVar40 = iVar39 + 4;
    pParse->nMem = iVar40;
    destA.eDest = '\r';
    destA.iSDParm = iVar43;
    destA.iSDParm2 = 0;
    destA.zAffSdst = (char *)0x0;
    destA.iSdst = 0;
    destA.nSdst = 0;
    local_58.eDest = '\r';
    local_58.iSDParm2 = 0;
    local_58.zAffSdst = (char *)0x0;
    local_58.iSdst = 0;
    local_58.nSdst = 0;
    iVar39 = iVar39 + 3;
    local_58.iSDParm = iVar22;
    sqlite3VdbeExplain(pParse,'\x01',"MERGE (%s)");
    iVar17 = sqlite3VdbeAddOp3(pVVar23,10,iVar43,0,pVVar23->nOp + 1);
    pSVar24->iLimit = iVar19;
    sqlite3VdbeExplain(pParse,'\x01',"LEFT");
    sqlite3Select(pParse,pSVar24,&destA);
    sqlite3VdbeAddOp3(pVVar23,0x44,iVar43,0,0);
    pPVar7 = pVVar23->pParse;
    pPVar7->nTempReg = '\0';
    pPVar7->nRangeReg = 0;
    iVar19 = pVVar23->nOp;
    if (pVVar23->db->mallocFailed == '\0') {
      iVar18 = iVar19 + -1;
      if (-1 < iVar17) {
        iVar18 = iVar17;
      }
      pOVar30 = pVVar23->aOp + iVar18;
    }
    else {
      pOVar30 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar30->p2 = iVar19;
    iVar18 = sqlite3VdbeAddOp3(pVVar23,10,iVar22,0,iVar19 + 1);
    iVar19 = p->iLimit;
    iVar17 = p->iOffset;
    p->iLimit = iVar44;
    p->iOffset = 0;
    sqlite3VdbeExplain(pParse,'\x01',"RIGHT");
    sqlite3Select(pParse,p,&local_58);
    p->iLimit = iVar19;
    p->iOffset = iVar17;
    sqlite3VdbeAddOp3(pVVar23,0x44,iVar22,0,0);
    pPVar7 = pVVar23->pParse;
    pPVar7->nTempReg = '\0';
    iVar19 = 0;
    pPVar7->nRangeReg = 0;
    iVar44 = generateOutputSubroutine(pParse,p,&destA,pDest,iVar39,iVar20,pKVar25,iVar15);
    if (bVar11) {
      iVar19 = generateOutputSubroutine(pParse,p,&local_58,pDest,iVar40,iVar20,pKVar25,iVar15);
    }
    if ((pKVar25 != (KeyInfo *)0x0) && (pKVar25->nRef = pKVar25->nRef - 1, pKVar25->nRef == 0)) {
      sqlite3DbFreeNN(pKVar25->db,pKVar25);
    }
    iVar17 = iVar15;
    iVar20 = iVar15;
    if (local_151 != 0x88) {
      iVar17 = sqlite3VdbeAddOp3(pVVar23,9,iVar40,iVar19,0);
      iVar20 = sqlite3VdbeAddOp3(pVVar23,0xb,iVar22,iVar15,0);
      sqlite3VdbeAddOp3(pVVar23,8,0,iVar17,0);
      LVar13 = sqlite3LogEstAdd(p->nSelectRow,pSVar24->nSelectRow);
      p->nSelectRow = LVar13;
    }
    if (bVar12 == 0x89) {
      p2 = iVar17;
      if (pSVar24->nSelectRow < p->nSelectRow) {
        p->nSelectRow = pSVar24->nSelectRow;
      }
    }
    else {
      p2 = sqlite3VdbeAddOp3(pVVar23,9,iVar39,iVar44,0);
      sqlite3VdbeAddOp3(pVVar23,0xb,iVar43,iVar15,0);
      sqlite3VdbeAddOp3(pVVar23,8,0,p2,0);
    }
    iVar44 = sqlite3VdbeAddOp3(pVVar23,9,iVar39,iVar44,0);
    sqlite3VdbeAddOp3(pVVar23,0xb,iVar43,iVar17,0);
    sqlite3VdbeAddOp3(pVVar23,8,0,iVar14,0);
    iVar39 = iVar44;
    if (bVar12 != 0x87) {
      if (bVar12 == 0x89) {
        iVar39 = iVar44 + 1;
      }
      else {
        iVar44 = sqlite3VdbeAddOp3(pVVar23,0xb,iVar43,iVar17,0);
        sqlite3VdbeAddOp3(pVVar23,8,0,iVar14,0);
      }
    }
    iVar17 = pVVar23->nOp;
    if (bVar11) {
      sqlite3VdbeAddOp3(pVVar23,9,iVar40,iVar19,0);
    }
    sqlite3VdbeAddOp3(pVVar23,0xb,iVar22,p2,0);
    sqlite3VdbeAddOp3(pVVar23,8,0,iVar14,0);
    if (pVVar23->db->mallocFailed == '\0') {
      iVar19 = pVVar23->nOp + -1;
      if (-1 < iVar18) {
        iVar19 = iVar18;
      }
      pOVar30 = pVVar23->aOp + iVar19;
    }
    else {
      pOVar30 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar30->p2 = pVVar23->nOp;
    sqlite3VdbeAddOp3(pVVar23,0xb,iVar43,iVar20,0);
    sqlite3VdbeAddOp3(pVVar23,0xb,iVar22,p2,0);
    sqlite3VdbeResolveLabel(pVVar23,iVar14);
    iVar14 = sqlite3VdbeAddOp3(pVVar23,0x59,0,0,0);
    sqlite3VdbeChangeP4(pVVar23,iVar14,(char *)zP4,-0xe);
    iVar21 = sqlite3VdbeAddOp3(pVVar23,0x5a,destA.iSdst,local_58.iSdst,iVar21);
    sqlite3VdbeChangeP4(pVVar23,iVar21,(char *)local_78,-8);
    if (0 < (long)pVVar23->nOp) {
      pVVar23->aOp[(long)pVVar23->nOp + -1].p5 = 1;
    }
    sqlite3VdbeAddOp3(pVVar23,0xd,iVar39,iVar44,iVar17);
    sqlite3VdbeResolveLabel(pVVar23,iVar15);
    if (pSVar41->pPrior != (Select *)0x0) {
      sqlite3ParserAddCleanup(pParse,sqlite3SelectDelete,pSVar41->pPrior);
    }
    pSVar41->pPrior = pSVar24;
    pSVar24->pNext = pSVar41;
    if (pSVar24->pOrderBy != (ExprList *)0x0) {
      exprListDeleteNN(psVar5,pSVar24->pOrderBy);
    }
    pSVar24->pOrderBy = (ExprList *)0x0;
    sqlite3VdbeExplainPop(pParse);
    return (uint)(pParse->nErr != 0);
  }
  if (pSVar41->pPrior == (Select *)0x0) {
    sqlite3VdbeExplain(pParse,'\x01',"COMPOUND QUERY");
    sqlite3VdbeExplain(pParse,'\x01',"LEFT-MOST SUBQUERY");
  }
  uVar4 = p->op;
  if ((uVar4 == 0x86) || (uVar4 == 0x88)) {
    if (uVar42 == '\x01') {
      iVar21 = dest.iSDParm;
    }
    else {
      iVar21 = pParse->nTab;
      pParse->nTab = iVar21 + 1;
      iVar15 = sqlite3VdbeAddOp3(pVVar23,0x76,iVar21,0,0);
      p->addrOpenEphm[0] = iVar15;
      pSVar24 = p;
      do {
        pSVar36 = pSVar24;
        pSVar24 = pSVar36->pNext;
      } while (pSVar24 != (Select *)0x0);
      puVar3 = &pSVar36->selFlags;
      *(byte *)puVar3 = (byte)*puVar3 | 0x20;
    }
    destA.eDest = '\x01';
    destA.iSDParm = iVar21;
    destA.iSDParm2 = 0;
    destA.zAffSdst = (char *)0x0;
    destA.iSdst = 0;
    destA.nSdst = 0;
    iVar15 = sqlite3Select(pParse,pSVar41,&destA);
    if (iVar15 != 0) goto LAB_00176b53;
    p->pPrior = (Select *)0x0;
    pEVar27 = p->pLimit;
    p->pLimit = (Expr *)0x0;
    destA.eDest = (p->op == 0x88) + '\x01';
    bVar12 = p->op + 0x79;
    if (bVar12 < 3) {
      pcVar34 = (&PTR_anon_var_dwarf_33a1b_001ccd88)[bVar12];
    }
    else {
      pcVar34 = "UNION";
    }
    sqlite3VdbeExplain(pParse,'\x01',"%s USING TEMP B-TREE",pcVar34);
    iVar15 = sqlite3Select(pParse,p,&destA);
    local_138 = p->pPrior;
    p->pPrior = pSVar41;
    p->pOrderBy = (ExprList *)0x0;
    if (p->op == 0x86) {
      LVar13 = sqlite3LogEstAdd(p->nSelectRow,pSVar41->nSelectRow);
      p->nSelectRow = LVar13;
    }
    if (p->pLimit != (Expr *)0x0) {
      sqlite3ExprDeleteNN(psVar5,p->pLimit);
    }
    p->pLimit = pEVar27;
    p->iLimit = 0;
    p->iOffset = 0;
    if ((uVar42 != '\x01') && (psVar5->mallocFailed == '\0')) {
      iVar14 = pParse->nLabel + -1;
      iVar19 = pParse->nLabel + -2;
      pParse->nLabel = iVar19;
      computeLimitRegisters(pParse,p,iVar14);
      sqlite3VdbeAddOp3(pVVar23,0x23,iVar21,iVar14,0);
      iVar20 = pVVar23->nOp;
      selectInnerLoop(pParse,p,iVar21,(SortCtx *)0x0,(DistinctCtx *)0x0,&dest,iVar19,iVar14);
      sqlite3VdbeResolveLabel(pVVar23,iVar19);
      sqlite3VdbeAddOp3(pVVar23,0x26,iVar21,iVar20,0);
      sqlite3VdbeResolveLabel(pVVar23,iVar14);
LAB_00177942:
      sqlite3VdbeAddOp3(pVVar23,0x7a,iVar21,0,0);
    }
  }
  else if (uVar4 == 0x87) {
    destA._0_8_ = destA._0_8_ & 0xffffffff00000000;
    iVar15 = p->iOffset;
    pSVar41->iLimit = p->iLimit;
    pSVar41->iOffset = iVar15;
    pSVar41->pLimit = p->pLimit;
    iVar15 = sqlite3Select(pParse,pSVar41,&dest);
    pSVar41->pLimit = (Expr *)0x0;
    if (iVar15 != 0) {
LAB_00176b53:
      pDest->iSdst = dest.iSdst;
      pDest->nSdst = dest.nSdst;
      return iVar15;
    }
    p->pPrior = (Select *)0x0;
    p1 = pSVar41->iLimit;
    uVar8 = pSVar41->iOffset;
    p->iLimit = p1;
    p->iOffset = uVar8;
    if (p1 == 0) {
      iVar21 = 0;
    }
    else {
      iVar21 = sqlite3VdbeAddOp3(pVVar23,0x10,p1,0,0);
      iVar15 = p->iOffset;
      if (iVar15 != 0) {
        sqlite3VdbeAddOp3(pVVar23,0xa0,p->iLimit,iVar15 + 1,iVar15);
      }
    }
    sqlite3VdbeExplain(pParse,'\x01',"UNION ALL");
    iVar15 = sqlite3Select(pParse,p,&dest);
    local_138 = p->pPrior;
    p->pPrior = pSVar41;
    LVar13 = sqlite3LogEstAdd(p->nSelectRow,pSVar41->nSelectRow);
    p->nSelectRow = LVar13;
    if (p->pLimit != (Expr *)0x0) {
      iVar14 = sqlite3ExprIsInteger(p->pLimit->pLeft,(int *)&destA);
      if ((0 < (int)destA._0_4_ && iVar14 != 0) &&
         (sVar37 = p->nSelectRow, LVar13 = sqlite3LogEst(destA._0_8_ & 0xffffffff), LVar13 < sVar37)
         ) {
        p->nSelectRow = LVar13;
      }
    }
    if (iVar21 != 0) {
      if (pVVar23->db->mallocFailed == '\0') {
        iVar14 = pVVar23->nOp + -1;
        if (-1 < iVar21) {
          iVar14 = iVar21;
        }
        pOVar30 = pVVar23->aOp + iVar14;
      }
      else {
        pOVar30 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar30->p2 = pVVar23->nOp;
    }
  }
  else {
    iVar21 = pParse->nTab;
    pParse->nTab = iVar21 + 2;
    iVar15 = sqlite3VdbeAddOp3(pVVar23,0x76,iVar21,0,0);
    p->addrOpenEphm[0] = iVar15;
    pSVar24 = p;
    do {
      pSVar36 = pSVar24;
      pSVar24 = pSVar36->pNext;
    } while (pSVar24 != (Select *)0x0);
    puVar3 = &pSVar36->selFlags;
    *(byte *)puVar3 = (byte)*puVar3 | 0x20;
    destA.eDest = '\x01';
    destA.iSDParm = iVar21;
    destA.iSDParm2 = 0;
    destA.zAffSdst = (char *)0x0;
    destA.iSdst = 0;
    destA.nSdst = 0;
    iVar15 = sqlite3Select(pParse,pSVar41,&destA);
    if (iVar15 != 0) goto LAB_00176b53;
    iVar14 = iVar21 + 1;
    iVar15 = sqlite3VdbeAddOp3(pVVar23,0x76,iVar14,0,0);
    p->addrOpenEphm[1] = iVar15;
    p->pPrior = (Select *)0x0;
    pEVar27 = p->pLimit;
    p->pLimit = (Expr *)0x0;
    destA.iSDParm = iVar14;
    bVar12 = p->op + 0x79;
    if (bVar12 < 3) {
      pcVar34 = (&PTR_anon_var_dwarf_33a1b_001ccd88)[bVar12];
    }
    else {
      pcVar34 = "UNION";
    }
    sqlite3VdbeExplain(pParse,'\x01',"%s USING TEMP B-TREE",pcVar34);
    iVar15 = sqlite3Select(pParse,p,&destA);
    local_138 = p->pPrior;
    p->pPrior = pSVar41;
    if (pSVar41->nSelectRow < p->nSelectRow) {
      p->nSelectRow = pSVar41->nSelectRow;
    }
    if (p->pLimit != (Expr *)0x0) {
      sqlite3ExprDeleteNN(psVar5,p->pLimit);
    }
    p->pLimit = pEVar27;
    if (iVar15 == 0) {
      iVar20 = pParse->nLabel + -1;
      iVar19 = pParse->nLabel + -2;
      pParse->nLabel = iVar19;
      computeLimitRegisters(pParse,p,iVar20);
      sqlite3VdbeAddOp3(pVVar23,0x23,iVar21,iVar20,0);
      if (pParse->nTempReg == '\0') {
        iVar43 = pParse->nMem + 1;
        pParse->nMem = iVar43;
      }
      else {
        bVar12 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar12;
        iVar43 = pParse->aTempReg[bVar12];
      }
      iVar44 = sqlite3VdbeAddOp3(pVVar23,0x86,iVar21,iVar43,0);
      iVar22 = sqlite3VdbeAddOp3(pVVar23,0x1b,iVar14,iVar19,iVar43);
      if (pVVar23->db->mallocFailed == '\0') {
        pOVar30 = pVVar23->aOp;
        pOVar30[iVar22].p4type = -3;
        pOVar30[iVar22].p4.i = 0;
      }
      if (iVar43 != 0) {
        bVar12 = pParse->nTempReg;
        if ((ulong)bVar12 < 8) {
          pParse->nTempReg = bVar12 + 1;
          pParse->aTempReg[bVar12] = iVar43;
        }
      }
      selectInnerLoop(pParse,p,iVar21,(SortCtx *)0x0,(DistinctCtx *)0x0,&dest,iVar19,iVar20);
      sqlite3VdbeResolveLabel(pVVar23,iVar19);
      sqlite3VdbeAddOp3(pVVar23,0x26,iVar21,iVar44,0);
      sqlite3VdbeResolveLabel(pVVar23,iVar20);
      sqlite3VdbeAddOp3(pVVar23,0x7a,iVar14,0,0);
      goto LAB_00177942;
    }
  }
  if (p->pNext == (Select *)0x0) {
    sqlite3VdbeExplainPop(pParse);
  }
LAB_00177ab4:
  if ((pParse->nErr == 0) && ((p->selFlags & 0x20) != 0)) {
    iVar21 = p->pEList->nExpr;
    pKVar25 = sqlite3KeyInfoAlloc(psVar5,iVar21,1);
    if (pKVar25 == (KeyInfo *)0x0) {
      iVar15 = 7;
    }
    else {
      if (iVar21 < 1) goto LAB_00177b70;
      lVar28 = 0;
      do {
        pCVar26 = multiSelectCollSeq(pParse,p,(int)lVar28);
        pKVar25->aColl[lVar28] = pCVar26;
        if (pCVar26 == (CollSeq *)0x0) {
          pKVar25->aColl[lVar28] = psVar5->pDfltColl;
        }
        lVar28 = lVar28 + 1;
      } while (iVar21 != (int)lVar28);
      for (; p != (Select *)0x0; p = p->pPrior) {
LAB_00177b70:
        lVar28 = 0;
        bVar11 = true;
        do {
          bVar38 = bVar11;
          iVar14 = p->addrOpenEphm[lVar28];
          if ((long)iVar14 < 0) break;
          if (pVVar23->db->mallocFailed == '\0') {
            pOVar30 = pVVar23->aOp + iVar14;
          }
          else {
            pOVar30 = (Op *)&sqlite3VdbeGetOp_dummy;
          }
          pOVar30->p2 = iVar21;
          pKVar25->nRef = pKVar25->nRef + 1;
          sqlite3VdbeChangeP4(pVVar23,iVar14,(char *)pKVar25,-8);
          p->addrOpenEphm[lVar28] = -1;
          lVar28 = 1;
          bVar11 = false;
        } while (bVar38);
      }
      pKVar25->nRef = pKVar25->nRef - 1;
      if (pKVar25->nRef == 0) {
        sqlite3DbFreeNN(pKVar25->db,pKVar25);
      }
    }
  }
  pDest->iSdst = dest.iSdst;
  pDest->nSdst = dest.nSdst;
  if (local_138 != (Select *)0x0) {
    sqlite3ParserAddCleanup(pParse,sqlite3SelectDelete,local_138);
  }
  return iVar15;
  while( true ) {
    pSVar24->nSelectRow = sVar37;
    pSVar24 = pSVar24->pNext;
    if (pSVar24 == (Select *)0x0) break;
LAB_001768a2:
    selectInnerLoop(pParse,pSVar24,-1,(SortCtx *)0x0,(DistinctCtx *)0x0,&dest,1,1);
    if (pEVar27 != (Expr *)0x0) break;
  }
  iVar15 = 0;
  goto LAB_00176b53;
  while (lVar28 = lVar28 + 0x68, (long)pSVar6->nSrc * 0x68 - lVar28 != 0) {
LAB_00176960:
    if (((&pSVar6->a[0].fg.field_0x1)[lVar28] & 0x40) != 0) {
      iVar21 = *(int *)((long)&pSVar6->a[0].iCursor + lVar28);
      goto LAB_0017752f;
    }
  }
  iVar21 = 0;
LAB_0017752f:
  pEVar29 = p->pOrderBy;
  iVar43 = pParse->nTab;
  iVar44 = iVar43 + 1;
  pParse->nTab = iVar44;
  if (p->op == 0x86) {
    uVar42 = '\x06' - (pEVar29 == (ExprList *)0x0);
    pParse->nTab = iVar43 + 2;
  }
  else {
    iVar44 = 0;
    uVar42 = (pEVar29 == (ExprList *)0x0) + '\a';
  }
  destA.eDest = uVar42;
  destA.iSDParm = iVar43;
  destA.iSDParm2 = 0;
  destA.zAffSdst = (char *)0x0;
  destA.iSdst = 0;
  destA.nSdst = 0;
  iVar22 = pParse->nMem + 1;
  pParse->nMem = iVar22;
  sqlite3VdbeAddOp3(p_00,0x79,iVar21,iVar22,iVar15);
  if (pEVar29 == (ExprList *)0x0) {
    sqlite3VdbeAddOp3(p_00,0x76,iVar43,iVar15,0);
  }
  else {
    pKVar25 = multiSelectOrderByKeyInfo(pParse,p,nExtra);
    iVar15 = sqlite3VdbeAddOp3(p_00,0x76,iVar43,pEVar29->nExpr + 2,0);
    sqlite3VdbeChangeP4(p_00,iVar15,(char *)pKVar25,-8);
    destA.pOrderBy = pEVar29;
  }
  if (iVar44 == 0) {
    uVar16 = p->selFlags;
  }
  else {
    iVar15 = sqlite3VdbeAddOp3(p_00,0x76,iVar44,0,0);
    p->addrOpenEphm[0] = iVar15;
    uVar16 = p->selFlags | 0x20;
    p->selFlags = uVar16;
  }
  p->pOrderBy = (ExprList *)0x0;
  pSVar41 = p;
  do {
    pSVar24 = pSVar41;
    if ((uVar16 & 8) != 0) {
      sqlite3ErrorMsg(pParse,"recursive aggregate queries not supported");
      goto LAB_00177a7d;
    }
    pSVar24->op = 0x87;
    pSVar41 = pSVar24->pPrior;
    uVar16 = pSVar41->selFlags;
  } while ((uVar16 >> 0xd & 1) != 0);
  pSVar41->pNext = (Select *)0x0;
  sqlite3VdbeExplain(pParse,'\x01',"SETUP");
  iVar15 = sqlite3Select(pParse,pSVar41,&destA);
  pSVar41->pNext = p;
  if (iVar15 == 0) {
    iVar15 = sqlite3VdbeAddOp3(p_00,0x23,iVar43,iVar19,0);
    sqlite3VdbeAddOp3(p_00,0x88,iVar21,0,0);
    if (pEVar29 == (ExprList *)0x0) {
      iVar39 = 0x86;
      iVar40 = 0;
      iVar44 = iVar22;
    }
    else {
      iVar39 = 0x5e;
      iVar44 = pEVar29->nExpr + 1;
      iVar40 = iVar22;
    }
    sqlite3VdbeAddOp3(p_00,iVar39,iVar43,iVar44,iVar40);
    sqlite3VdbeAddOp3(p_00,0x82,iVar43,0,0);
    iVar43 = pParse->nLabel + -1;
    pParse->nLabel = iVar43;
    if (0 < iVar20) {
      sqlite3VdbeAddOp3(p_00,0x31,iVar20,iVar43,1);
    }
    selectInnerLoop(pParse,p,iVar21,(SortCtx *)0x0,(DistinctCtx *)0x0,&dest,iVar43,iVar19);
    if (iVar14 != 0) {
      sqlite3VdbeAddOp3(p_00,0x3c,iVar14,iVar19,0);
    }
    sqlite3VdbeResolveLabel(p_00,iVar43);
    pSVar24->pPrior = (Select *)0x0;
    sqlite3VdbeExplain(pParse,'\x01',"RECURSIVE STEP");
    sqlite3Select(pParse,p,&destA);
    pSVar24->pPrior = pSVar41;
    sqlite3VdbeAddOp3(p_00,8,0,iVar15,0);
    sqlite3VdbeResolveLabel(p_00,iVar19);
  }
LAB_00177a7d:
  if (p->pOrderBy != (ExprList *)0x0) {
    exprListDeleteNN(pParse->db,p->pOrderBy);
  }
  p->pOrderBy = pEVar29;
  p->pLimit = pEVar27;
LAB_00177aa5:
  local_138 = (Select *)0x0;
  iVar15 = 0;
  goto LAB_00177ab4;
}

Assistant:

static int multiSelect(
  Parse *pParse,        /* Parsing context */
  Select *p,            /* The right-most of SELECTs to be coded */
  SelectDest *pDest     /* What to do with query results */
){
  int rc = SQLITE_OK;   /* Success code from a subroutine */
  Select *pPrior;       /* Another SELECT immediately to our left */
  Vdbe *v;              /* Generate code to this VDBE */
  SelectDest dest;      /* Alternative data destination */
  Select *pDelete = 0;  /* Chain of simple selects to delete */
  sqlite3 *db;          /* Database connection */

  /* Make sure there is no ORDER BY or LIMIT clause on prior SELECTs.  Only
  ** the last (right-most) SELECT in the series may have an ORDER BY or LIMIT.
  */
  assert( p && p->pPrior );  /* Calling function guarantees this much */
  assert( (p->selFlags & SF_Recursive)==0 || p->op==TK_ALL || p->op==TK_UNION );
  assert( p->selFlags & SF_Compound );
  db = pParse->db;
  pPrior = p->pPrior;
  dest = *pDest;
  assert( pPrior->pOrderBy==0 );
  assert( pPrior->pLimit==0 );

  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );  /* The VDBE already created by calling function */

  /* Create the destination temporary table if necessary
  */
  if( dest.eDest==SRT_EphemTab ){
    assert( p->pEList );
    sqlite3VdbeAddOp2(v, OP_OpenEphemeral, dest.iSDParm, p->pEList->nExpr);
    dest.eDest = SRT_Table;
  }

  /* Special handling for a compound-select that originates as a VALUES clause.
  */
  if( p->selFlags & SF_MultiValue ){
    rc = multiSelectValues(pParse, p, &dest);
    if( rc>=0 ) goto multi_select_end;
    rc = SQLITE_OK;
  }

  /* Make sure all SELECTs in the statement have the same number of elements
  ** in their result sets.
  */
  assert( p->pEList && pPrior->pEList );
  assert( p->pEList->nExpr==pPrior->pEList->nExpr );

#ifndef SQLITE_OMIT_CTE
  if( (p->selFlags & SF_Recursive)!=0 && hasAnchor(p) ){
    generateWithRecursiveQuery(pParse, p, &dest);
  }else
#endif

  /* Compound SELECTs that have an ORDER BY clause are handled separately.
  */
  if( p->pOrderBy ){
    return multiSelectOrderBy(pParse, p, pDest);
  }else{

#ifndef SQLITE_OMIT_EXPLAIN
    if( pPrior->pPrior==0 ){
      ExplainQueryPlan((pParse, 1, "COMPOUND QUERY"));
      ExplainQueryPlan((pParse, 1, "LEFT-MOST SUBQUERY"));
    }
#endif

    /* Generate code for the left and right SELECT statements.
    */
    switch( p->op ){
      case TK_ALL: {
        int addr = 0;
        int nLimit = 0;  /* Initialize to suppress harmless compiler warning */
        assert( !pPrior->pLimit );
        pPrior->iLimit = p->iLimit;
        pPrior->iOffset = p->iOffset;
        pPrior->pLimit = p->pLimit;
        SELECTTRACE(1, pParse, p, ("multiSelect UNION ALL left...\n"));
        rc = sqlite3Select(pParse, pPrior, &dest);
        pPrior->pLimit = 0;
        if( rc ){
          goto multi_select_end;
        }
        p->pPrior = 0;
        p->iLimit = pPrior->iLimit;
        p->iOffset = pPrior->iOffset;
        if( p->iLimit ){
          addr = sqlite3VdbeAddOp1(v, OP_IfNot, p->iLimit); VdbeCoverage(v);
          VdbeComment((v, "Jump ahead if LIMIT reached"));
          if( p->iOffset ){
            sqlite3VdbeAddOp3(v, OP_OffsetLimit,
                              p->iLimit, p->iOffset+1, p->iOffset);
          }
        }
        ExplainQueryPlan((pParse, 1, "UNION ALL"));
        SELECTTRACE(1, pParse, p, ("multiSelect UNION ALL right...\n"));
        rc = sqlite3Select(pParse, p, &dest);
        testcase( rc!=SQLITE_OK );
        pDelete = p->pPrior;
        p->pPrior = pPrior;
        p->nSelectRow = sqlite3LogEstAdd(p->nSelectRow, pPrior->nSelectRow);
        if( p->pLimit
         && sqlite3ExprIsInteger(p->pLimit->pLeft, &nLimit)
         && nLimit>0 && p->nSelectRow > sqlite3LogEst((u64)nLimit)
        ){
          p->nSelectRow = sqlite3LogEst((u64)nLimit);
        }
        if( addr ){
          sqlite3VdbeJumpHere(v, addr);
        }
        break;
      }
      case TK_EXCEPT:
      case TK_UNION: {
        int unionTab;    /* Cursor number of the temp table holding result */
        u8 op = 0;       /* One of the SRT_ operations to apply to self */
        int priorOp;     /* The SRT_ operation to apply to prior selects */
        Expr *pLimit;    /* Saved values of p->nLimit  */
        int addr;
        SelectDest uniondest;

        testcase( p->op==TK_EXCEPT );
        testcase( p->op==TK_UNION );
        priorOp = SRT_Union;
        if( dest.eDest==priorOp ){
          /* We can reuse a temporary table generated by a SELECT to our
          ** right.
          */
          assert( p->pLimit==0 );      /* Not allowed on leftward elements */
          unionTab = dest.iSDParm;
        }else{
          /* We will need to create our own temporary table to hold the
          ** intermediate results.
          */
          unionTab = pParse->nTab++;
          assert( p->pOrderBy==0 );
          addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, unionTab, 0);
          assert( p->addrOpenEphm[0] == -1 );
          p->addrOpenEphm[0] = addr;
          findRightmost(p)->selFlags |= SF_UsesEphemeral;
          assert( p->pEList );
        }


        /* Code the SELECT statements to our left
        */
        assert( !pPrior->pOrderBy );
        sqlite3SelectDestInit(&uniondest, priorOp, unionTab);
        SELECTTRACE(1, pParse, p, ("multiSelect EXCEPT/UNION left...\n"));
        rc = sqlite3Select(pParse, pPrior, &uniondest);
        if( rc ){
          goto multi_select_end;
        }

        /* Code the current SELECT statement
        */
        if( p->op==TK_EXCEPT ){
          op = SRT_Except;
        }else{
          assert( p->op==TK_UNION );
          op = SRT_Union;
        }
        p->pPrior = 0;
        pLimit = p->pLimit;
        p->pLimit = 0;
        uniondest.eDest = op;
        ExplainQueryPlan((pParse, 1, "%s USING TEMP B-TREE",
                          sqlite3SelectOpName(p->op)));
        SELECTTRACE(1, pParse, p, ("multiSelect EXCEPT/UNION right...\n"));
        rc = sqlite3Select(pParse, p, &uniondest);
        testcase( rc!=SQLITE_OK );
        assert( p->pOrderBy==0 );
        pDelete = p->pPrior;
        p->pPrior = pPrior;
        p->pOrderBy = 0;
        if( p->op==TK_UNION ){
          p->nSelectRow = sqlite3LogEstAdd(p->nSelectRow, pPrior->nSelectRow);
        }
        sqlite3ExprDelete(db, p->pLimit);
        p->pLimit = pLimit;
        p->iLimit = 0;
        p->iOffset = 0;

        /* Convert the data in the temporary table into whatever form
        ** it is that we currently need.
        */
        assert( unionTab==dest.iSDParm || dest.eDest!=priorOp );
        assert( p->pEList || db->mallocFailed );
        if( dest.eDest!=priorOp && db->mallocFailed==0 ){
          int iCont, iBreak, iStart;
          iBreak = sqlite3VdbeMakeLabel(pParse);
          iCont = sqlite3VdbeMakeLabel(pParse);
          computeLimitRegisters(pParse, p, iBreak);
          sqlite3VdbeAddOp2(v, OP_Rewind, unionTab, iBreak); VdbeCoverage(v);
          iStart = sqlite3VdbeCurrentAddr(v);
          selectInnerLoop(pParse, p, unionTab,
                          0, 0, &dest, iCont, iBreak);
          sqlite3VdbeResolveLabel(v, iCont);
          sqlite3VdbeAddOp2(v, OP_Next, unionTab, iStart); VdbeCoverage(v);
          sqlite3VdbeResolveLabel(v, iBreak);
          sqlite3VdbeAddOp2(v, OP_Close, unionTab, 0);
        }
        break;
      }
      default: assert( p->op==TK_INTERSECT ); {
        int tab1, tab2;
        int iCont, iBreak, iStart;
        Expr *pLimit;
        int addr;
        SelectDest intersectdest;
        int r1;

        /* INTERSECT is different from the others since it requires
        ** two temporary tables.  Hence it has its own case.  Begin
        ** by allocating the tables we will need.
        */
        tab1 = pParse->nTab++;
        tab2 = pParse->nTab++;
        assert( p->pOrderBy==0 );

        addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, tab1, 0);
        assert( p->addrOpenEphm[0] == -1 );
        p->addrOpenEphm[0] = addr;
        findRightmost(p)->selFlags |= SF_UsesEphemeral;
        assert( p->pEList );

        /* Code the SELECTs to our left into temporary table "tab1".
        */
        sqlite3SelectDestInit(&intersectdest, SRT_Union, tab1);
        SELECTTRACE(1, pParse, p, ("multiSelect INTERSECT left...\n"));
        rc = sqlite3Select(pParse, pPrior, &intersectdest);
        if( rc ){
          goto multi_select_end;
        }

        /* Code the current SELECT into temporary table "tab2"
        */
        addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, tab2, 0);
        assert( p->addrOpenEphm[1] == -1 );
        p->addrOpenEphm[1] = addr;
        p->pPrior = 0;
        pLimit = p->pLimit;
        p->pLimit = 0;
        intersectdest.iSDParm = tab2;
        ExplainQueryPlan((pParse, 1, "%s USING TEMP B-TREE",
                          sqlite3SelectOpName(p->op)));
        SELECTTRACE(1, pParse, p, ("multiSelect INTERSECT right...\n"));
        rc = sqlite3Select(pParse, p, &intersectdest);
        testcase( rc!=SQLITE_OK );
        pDelete = p->pPrior;
        p->pPrior = pPrior;
        if( p->nSelectRow>pPrior->nSelectRow ){
          p->nSelectRow = pPrior->nSelectRow;
        }
        sqlite3ExprDelete(db, p->pLimit);
        p->pLimit = pLimit;

        /* Generate code to take the intersection of the two temporary
        ** tables.
        */
        if( rc ) break;
        assert( p->pEList );
        iBreak = sqlite3VdbeMakeLabel(pParse);
        iCont = sqlite3VdbeMakeLabel(pParse);
        computeLimitRegisters(pParse, p, iBreak);
        sqlite3VdbeAddOp2(v, OP_Rewind, tab1, iBreak); VdbeCoverage(v);
        r1 = sqlite3GetTempReg(pParse);
        iStart = sqlite3VdbeAddOp2(v, OP_RowData, tab1, r1);
        sqlite3VdbeAddOp4Int(v, OP_NotFound, tab2, iCont, r1, 0);
        VdbeCoverage(v);
        sqlite3ReleaseTempReg(pParse, r1);
        selectInnerLoop(pParse, p, tab1,
                        0, 0, &dest, iCont, iBreak);
        sqlite3VdbeResolveLabel(v, iCont);
        sqlite3VdbeAddOp2(v, OP_Next, tab1, iStart); VdbeCoverage(v);
        sqlite3VdbeResolveLabel(v, iBreak);
        sqlite3VdbeAddOp2(v, OP_Close, tab2, 0);
        sqlite3VdbeAddOp2(v, OP_Close, tab1, 0);
        break;
      }
    }

  #ifndef SQLITE_OMIT_EXPLAIN
    if( p->pNext==0 ){
      ExplainQueryPlanPop(pParse);
    }
  #endif
  }
  if( pParse->nErr ) goto multi_select_end;

  /* Compute collating sequences used by
  ** temporary tables needed to implement the compound select.
  ** Attach the KeyInfo structure to all temporary tables.
  **
  ** This section is run by the right-most SELECT statement only.
  ** SELECT statements to the left always skip this part.  The right-most
  ** SELECT might also skip this part if it has no ORDER BY clause and
  ** no temp tables are required.
  */
  if( p->selFlags & SF_UsesEphemeral ){
    int i;                        /* Loop counter */
    KeyInfo *pKeyInfo;            /* Collating sequence for the result set */
    Select *pLoop;                /* For looping through SELECT statements */
    CollSeq **apColl;             /* For looping through pKeyInfo->aColl[] */
    int nCol;                     /* Number of columns in result set */

    assert( p->pNext==0 );
    assert( p->pEList!=0 );
    nCol = p->pEList->nExpr;
    pKeyInfo = sqlite3KeyInfoAlloc(db, nCol, 1);
    if( !pKeyInfo ){
      rc = SQLITE_NOMEM_BKPT;
      goto multi_select_end;
    }
    for(i=0, apColl=pKeyInfo->aColl; i<nCol; i++, apColl++){
      *apColl = multiSelectCollSeq(pParse, p, i);
      if( 0==*apColl ){
        *apColl = db->pDfltColl;
      }
    }

    for(pLoop=p; pLoop; pLoop=pLoop->pPrior){
      for(i=0; i<2; i++){
        int addr = pLoop->addrOpenEphm[i];
        if( addr<0 ){
          /* If [0] is unused then [1] is also unused.  So we can
          ** always safely abort as soon as the first unused slot is found */
          assert( pLoop->addrOpenEphm[1]<0 );
          break;
        }
        sqlite3VdbeChangeP2(v, addr, nCol);
        sqlite3VdbeChangeP4(v, addr, (char*)sqlite3KeyInfoRef(pKeyInfo),
                            P4_KEYINFO);
        pLoop->addrOpenEphm[i] = -1;
      }
    }
    sqlite3KeyInfoUnref(pKeyInfo);
  }

multi_select_end:
  pDest->iSdst = dest.iSdst;
  pDest->nSdst = dest.nSdst;
  if( pDelete ){
    sqlite3ParserAddCleanup(pParse,
        (void(*)(sqlite3*,void*))sqlite3SelectDelete,
        pDelete);
  }
  return rc;
}